

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

int datatypes_match(MOJOSHADER_astDataType *a,MOJOSHADER_astDataType *b)

{
  int iVar1;
  int local_24;
  int i;
  MOJOSHADER_astDataType *b_local;
  MOJOSHADER_astDataType *a_local;
  
  if (a == b) {
    a_local._4_4_ = 1;
  }
  else if (a->type == b->type) {
    switch(a->type) {
    case MOJOSHADER_AST_DATATYPE_STRUCT:
      if ((a->array).elements == (b->array).elements) {
        for (local_24 = 0; local_24 < (a->array).elements; local_24 = local_24 + 1) {
          iVar1 = datatypes_match(*(MOJOSHADER_astDataType **)
                                   ((long)(a->array).base + (long)local_24 * 0x10),
                                  *(MOJOSHADER_astDataType **)
                                   ((long)(b->array).base + (long)local_24 * 0x10));
          if (iVar1 == 0) {
            return 0;
          }
          if (*(long *)((long)(a->array).base + (long)local_24 * 0x10 + 8) !=
              *(long *)((long)(b->array).base + (long)local_24 * 0x10 + 8)) {
            return 0;
          }
        }
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_ARRAY:
      if ((a->array).elements == (b->array).elements) {
        iVar1 = datatypes_match((a->array).base,(b->array).base);
        if (iVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = 1;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_VECTOR:
      if ((a->array).elements == (b->array).elements) {
        iVar1 = datatypes_match((a->array).base,(b->array).base);
        if (iVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = 1;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_MATRIX:
      if ((a->array).elements == (b->array).elements) {
        if ((a->matrix).columns == (b->matrix).columns) {
          iVar1 = datatypes_match((a->array).base,(b->array).base);
          if (iVar1 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            a_local._4_4_ = 1;
          }
        }
        else {
          a_local._4_4_ = 0;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_BUFFER:
      a_local._4_4_ = datatypes_match((a->array).base,(b->array).base);
      break;
    case MOJOSHADER_AST_DATATYPE_FUNCTION:
      if ((a->function).num_params == (b->function).num_params) {
        if ((a->function).intrinsic == (b->function).intrinsic) {
          iVar1 = datatypes_match((a->array).base,(b->array).base);
          if (iVar1 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            for (local_24 = 0; local_24 < (a->function).num_params; local_24 = local_24 + 1) {
              iVar1 = datatypes_match(*(MOJOSHADER_astDataType **)
                                       ((a->user).name + (long)local_24 * 8),
                                      *(MOJOSHADER_astDataType **)
                                       ((b->user).name + (long)local_24 * 8));
              if (iVar1 == 0) {
                return 0;
              }
            }
            a_local._4_4_ = 1;
          }
        }
        else {
          a_local._4_4_ = 0;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_USER:
      a_local._4_4_ = 0;
      break;
    default:
      __assert_fail("0 && \"unexpected case\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x13d,
                    "int datatypes_match(const MOJOSHADER_astDataType *, const MOJOSHADER_astDataType *)"
                   );
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int datatypes_match(const MOJOSHADER_astDataType *a,
                           const MOJOSHADER_astDataType *b)
{
    int i;

    if (a == b)
        return 1;
    else if (a->type != b->type)
        return 0;

    switch (a->type)
    {
        case MOJOSHADER_AST_DATATYPE_STRUCT:
            if (a->structure.member_count != b->structure.member_count)
                return 0;
            for (i = 0; i < a->structure.member_count; i++)
            {
                if (!datatypes_match(a->structure.members[i].datatype,
                                     b->structure.members[i].datatype))
                    return 0;
                // stringcache'd, pointer compare is safe.
                else if (a->structure.members[i].identifier !=
                         b->structure.members[i].identifier)
                    return 0;
            } // for
            return 1;

        case MOJOSHADER_AST_DATATYPE_ARRAY:
            if (a->array.elements != b->array.elements)
                return 0;
            else if (!datatypes_match(a->array.base, b->array.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_VECTOR:
            if (a->vector.elements != b->vector.elements)
                return 0;
            else if (!datatypes_match(a->vector.base, b->vector.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_MATRIX:
            if (a->matrix.rows != b->matrix.rows)
                return 0;
            else if (a->matrix.columns != b->matrix.columns)
                return 0;
            else if (!datatypes_match(a->matrix.base, b->matrix.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_BUFFER:
            return datatypes_match(a->buffer.base, b->buffer.base);

        case MOJOSHADER_AST_DATATYPE_FUNCTION:
            if (a->function.num_params != b->function.num_params)
                return 0;
            else if (a->function.intrinsic != b->function.intrinsic)
                return 0;
            else if (!datatypes_match(a->function.retval, b->function.retval))
                return 0;
            for (i = 0; i < a->function.num_params; i++)
            {
                if (!datatypes_match(a->function.params[i], b->function.params[i]))
                    return 0;
            } // for
            return 1;

        case MOJOSHADER_AST_DATATYPE_USER:
            return 0;  // pointers must match, this clearly didn't.

        default:
            assert(0 && "unexpected case");
            return 0;
    } // switch

    return 0;
}